

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

cmStateSnapshot * __thiscall
cmState::CreateFunctionCallSnapshot
          (cmStateSnapshot *__return_storage_ptr__,cmState *this,cmStateSnapshot *originSnapshot,
          string *fileName)

{
  cmLinkedTree<cmDefinitions> *pcVar1;
  PositionType PVar2;
  PositionType PVar3;
  iterator it;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar4;
  bool bVar5;
  ReferenceType __src;
  PointerType pSVar6;
  PointerType pBVar7;
  PointerType pSVar8;
  long lVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  byte bVar12;
  iterator iVar13;
  iterator it_00;
  SnapshotDataType in_stack_fffffffffffffd18;
  cmLinkedTree<cmDefinitions> *local_188;
  PositionType local_180;
  iterator origin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_138;
  PositionType PStack_130;
  iterator local_128;
  undefined8 local_118 [26];
  cmLinkedTree<cmStateDetail::SnapshotDataType> *local_48;
  PositionType PStack_40;
  undefined1 local_30 [8];
  PositionType pos;
  string *fileName_local;
  cmStateSnapshot *originSnapshot_local;
  cmState *this_local;
  
  bVar12 = 0;
  local_48 = (originSnapshot->Position).Tree;
  PStack_40 = (originSnapshot->Position).Position;
  pos.Position = (PositionType)fileName;
  __src = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator*
                    (&originSnapshot->Position);
  memcpy(local_118,__src,0xd0);
  PVar3 = PStack_40;
  pcVar4 = local_48;
  puVar10 = local_118;
  puVar11 = (undefined8 *)&stack0xfffffffffffffd18;
  for (lVar9 = 0x1a; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar11 = *puVar10;
    puVar10 = puVar10 + (ulong)bVar12 * -2 + 1;
    puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
  }
  it_00.Position = PVar3;
  it_00.Tree = pcVar4;
  _local_30 = cmLinkedTree<cmStateDetail::SnapshotDataType>::Push
                        (&this->SnapshotData,it_00,in_stack_fffffffffffffd18);
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_30)
  ;
  PVar3 = (originSnapshot->Position).Position;
  (pSVar6->ScopeParent).Tree = (originSnapshot->Position).Tree;
  (pSVar6->ScopeParent).Position = PVar3;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_30)
  ;
  pSVar6->SnapshotType = FunctionCallType;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_30)
  ;
  pSVar6->Keep = false;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&originSnapshot->Position);
  local_138 = (pSVar6->ExecutionListFile).Tree;
  PStack_130 = (pSVar6->ExecutionListFile).Position;
  std::__cxx11::string::string((string *)&local_158,(string *)pos.Position);
  it.Position = PStack_130;
  it.Tree = local_138;
  local_128 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Push(&this->ExecutionListFiles,it,&local_158);
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_30)
  ;
  pSVar6->ExecutionListFile = local_128;
  std::__cxx11::string::~string((string *)&local_158);
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_30)
  ;
  pBVar7 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar6->BuildSystemDirectory);
  (pBVar7->DirectoryEnd).Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_30;
  (pBVar7->DirectoryEnd).Position = (PositionType)pos.Tree;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&originSnapshot->Position);
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_30)
  ;
  (pSVar8->PolicyScope).Tree = (pSVar6->Policies).Tree;
  (pSVar8->PolicyScope).Position = (pSVar6->Policies).Position;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&originSnapshot->Position);
  bVar5 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar6->Vars);
  if (!bVar5) {
    __assert_fail("originSnapshot.Position->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                  ,0x30f,
                  "cmStateSnapshot cmState::CreateFunctionCallSnapshot(const cmStateSnapshot &, const std::string &)"
                 );
  }
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&originSnapshot->Position);
  pcVar1 = (pSVar6->Vars).Tree;
  PVar2 = (pSVar6->Vars).Position;
  iVar13 = pSVar6->Vars;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_30)
  ;
  (pSVar6->Parent).Tree = pcVar1;
  (pSVar6->Parent).Position = PVar2;
  iVar13 = cmLinkedTree<cmDefinitions>::Push(&this->VarTree,iVar13);
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_30)
  ;
  local_188 = iVar13.Tree;
  (pSVar6->Vars).Tree = local_188;
  local_180 = iVar13.Position;
  (pSVar6->Vars).Position = local_180;
  cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,_local_30);
  return __return_storage_ptr__;
}

Assistant:

cmStateSnapshot cmState::CreateFunctionCallSnapshot(
  cmStateSnapshot const& originSnapshot, std::string const& fileName)
{
  cmStateDetail::PositionType pos =
    this->SnapshotData.Push(originSnapshot.Position, *originSnapshot.Position);
  pos->ScopeParent = originSnapshot.Position;
  pos->SnapshotType = cmStateEnums::FunctionCallType;
  pos->Keep = false;
  pos->ExecutionListFile = this->ExecutionListFiles.Push(
    originSnapshot.Position->ExecutionListFile, fileName);
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  assert(originSnapshot.Position->Vars.IsValid());
  cmLinkedTree<cmDefinitions>::iterator origin = originSnapshot.Position->Vars;
  pos->Parent = origin;
  pos->Vars = this->VarTree.Push(origin);
  return cmStateSnapshot(this, pos);
}